

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall pbrt::PointLight::Phi(PointLight *this,SampledWavelengths *lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar5;
  SampledSpectrum local_10;
  
  fVar1 = this->scale;
  auVar4 = (undefined1  [56])0x0;
  SVar5 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar3._0_8_ = SVar5.values.values._0_8_;
  auVar3._8_56_ = auVar4;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar5.values.values._8_8_;
  local_10.values.values = (array<float,_4>)vmovlhps_avx(auVar3._0_16_,auVar2);
  SVar5 = SampledSpectrum::operator*(&local_10,fVar1 * 12.566371);
  return (array<float,_4>)(array<float,_4>)SVar5;
}

Assistant:

SampledSpectrum PointLight::Phi(const SampledWavelengths &lambda) const {
    return 4 * Pi * scale * I.Sample(lambda);
}